

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CService * GetLocalAddress(CNode *peer)

{
  long lVar1;
  uint16_t uVar2;
  CService *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffff38;
  uint16_t in_stack_ffffffffffffff3e;
  CNetAddr *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  CService *this;
  CNode *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  GetLocal(in_stack_ffffffffffffffa8);
  CNetAddr::CNetAddr(in_stack_ffffffffffffff40);
  uVar2 = GetListenPort();
  CService::CService((CService *)CONCAT26(uVar2,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40
                     ,in_stack_ffffffffffffff3e);
  std::optional<CService>::value_or<CService>
            ((optional<CService> *)this,(CService *)CONCAT26(uVar2,in_stack_ffffffffffffff48));
  CService::~CService((CService *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  CNetAddr::~CNetAddr((CNetAddr *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  std::optional<CService>::~optional
            ((optional<CService> *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CService GetLocalAddress(const CNode& peer)
{
    return GetLocal(peer).value_or(CService{CNetAddr(), GetListenPort()});
}